

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralItem::~IfcStructuralItem(IfcStructuralItem *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x838d18;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x838d90;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x838d40;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x838d68;
  puVar1 = *(undefined1 **)
            &(this->super_IfcProduct).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x838e30;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x838e58;
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x60;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcProduct).super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcProduct).super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcStructuralItem() : Object("IfcStructuralItem") {}